

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O0

ON_PointGrid * __thiscall ON_PointGrid::operator=(ON_PointGrid *this,ON_PointGrid *src)

{
  int iVar1;
  ON_3dPoint *pOVar2;
  ON_3dPoint *pOVar3;
  int local_20;
  int local_1c;
  int j;
  int i;
  ON_PointGrid *src_local;
  ON_PointGrid *this_local;
  
  if (this != src) {
    ON_Geometry::operator=(&this->super_ON_Geometry,&src->super_ON_Geometry);
    this->m_point_count[0] = src->m_point_count[0];
    this->m_point_count[1] = src->m_point_count[1];
    this->m_point_stride0 = this->m_point_count[1];
    iVar1 = PointCount(this);
    ON_SimpleArray<ON_3dPoint>::Reserve
              (&(this->m_point).super_ON_SimpleArray<ON_3dPoint>,(long)iVar1);
    iVar1 = PointCount(this);
    ON_SimpleArray<ON_3dPoint>::SetCount(&(this->m_point).super_ON_SimpleArray<ON_3dPoint>,iVar1);
    iVar1 = PointCount(this);
    if (0 < iVar1) {
      if (this->m_point_stride0 == src->m_point_stride0) {
        pOVar2 = ON_SimpleArray<ON_3dPoint>::Array
                           (&(this->m_point).super_ON_SimpleArray<ON_3dPoint>);
        pOVar3 = ON_SimpleArray<ON_3dPoint>::Array(&(src->m_point).super_ON_SimpleArray<ON_3dPoint>)
        ;
        iVar1 = PointCount(this);
        memcpy(pOVar2,pOVar3,(long)iVar1 * 0x18);
      }
      else {
        for (local_1c = 0; local_1c < this->m_point_count[0]; local_1c = local_1c + 1) {
          for (local_20 = 0; local_20 < this->m_point_count[1]; local_20 = local_20 + 1) {
            pOVar2 = operator[](src,local_1c);
            pOVar2 = pOVar2 + local_20;
            pOVar3 = ON_SimpleArray<ON_3dPoint>::operator[]
                               (&(this->m_point).super_ON_SimpleArray<ON_3dPoint>,
                                local_1c * this->m_point_stride0 + local_20);
            pOVar3->x = pOVar2->x;
            pOVar3->y = pOVar2->y;
            pOVar3->z = pOVar2->z;
          }
        }
      }
    }
  }
  return this;
}

Assistant:

ON_PointGrid& ON_PointGrid::operator=( const ON_PointGrid& src )
{
  if ( this != &src ) {
    ON_Geometry::operator=(src);
    m_point_count[0] = src.m_point_count[0];
    m_point_count[1] = src.m_point_count[1];
    m_point_stride0 = m_point_count[1];
    m_point.Reserve(PointCount());
    m_point.SetCount(PointCount());
    if ( PointCount() > 0 ) {
      // copy cv array
      if ( m_point_stride0 == src.m_point_stride0 ) {
        memcpy( m_point.Array(), src.m_point.Array(), PointCount()*sizeof(ON_3dPoint) );
      }
      else {
        int i, j;
        for ( i = 0; i < m_point_count[0]; i++ ) for ( j = 0; j < m_point_count[1]; j++ ) {
          m_point[i*m_point_stride0+j] = src[i][j];
        }
      }
    }
  }
  return *this;
}